

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O1

string * __thiscall
OpenMPMapClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPMapClause *this)

{
  OpenMPMapClauseModifier OVar1;
  OpenMPMapClauseModifier OVar2;
  OpenMPMapClauseModifier OVar3;
  OpenMPMapClauseType OVar4;
  pointer pcVar5;
  string clause_string;
  string local_78;
  long *local_58;
  ulong local_50;
  long local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"map ","");
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"(","");
  OVar1 = this->modifier1;
  OVar2 = this->modifier2;
  OVar3 = this->modifier3;
  OVar4 = this->type;
  if ((OVar1 == OMPC_MAP_MODIFIER_always) || (OVar1 == OMPC_MAP_MODIFIER_close)) {
LAB_0017c022:
    std::__cxx11::string::append((char *)&local_58);
  }
  else if (OVar1 == OMPC_MAP_MODIFIER_mapper) {
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::append((char *)&local_58);
    pcVar5 = (this->mapper_identifier)._M_dataplus._M_p;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar5,pcVar5 + (this->mapper_identifier)._M_string_length);
    std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    goto LAB_0017c022;
  }
  if (OVar2 == OMPC_MAP_MODIFIER_always) {
LAB_0017c0cd:
    std::__cxx11::string::append((char *)&local_58);
  }
  else {
    if (OVar2 == OMPC_MAP_MODIFIER_mapper) {
      std::__cxx11::string::append((char *)&local_58);
      std::__cxx11::string::append((char *)&local_58);
      pcVar5 = (this->mapper_identifier)._M_dataplus._M_p;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar5,pcVar5 + (this->mapper_identifier)._M_string_length);
      std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0017c0cd;
    }
    if (OVar2 == OMPC_MAP_MODIFIER_close) goto LAB_0017c0cd;
  }
  if (OVar3 != OMPC_MAP_MODIFIER_always) {
    if (OVar3 == OMPC_MAP_MODIFIER_mapper) {
      std::__cxx11::string::append((char *)&local_58);
      std::__cxx11::string::append((char *)&local_58);
      pcVar5 = (this->mapper_identifier)._M_dataplus._M_p;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar5,pcVar5 + (this->mapper_identifier)._M_string_length);
      std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    else if (OVar3 != OMPC_MAP_MODIFIER_close) goto LAB_0017c17f;
  }
  std::__cxx11::string::append((char *)&local_58);
LAB_0017c17f:
  if (OVar4 < OMPC_MAP_TYPE_unknown) {
    std::__cxx11::string::append((char *)&local_58);
  }
  if (1 < local_50) {
    std::__cxx11::string::append((char *)&local_58);
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_78,&this->super_OpenMPClause);
  std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_58);
  if (3 < local_50) {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPMapClause::toString() {

    std::string result = "map ";
    std::string clause_string = "(";
    OpenMPMapClauseModifier modifier1 = this->getModifier1();
    OpenMPMapClauseModifier modifier2 = this->getModifier2();
    OpenMPMapClauseModifier modifier3 = this->getModifier3();

    OpenMPMapClauseType type = this->getType();
    switch (modifier1) {
        case OMPC_MAP_MODIFIER_always:
            clause_string += "always";
            break;
        case OMPC_MAP_MODIFIER_close:
            clause_string += "close";
            break;
        case OMPC_MAP_MODIFIER_mapper:
            clause_string += "mapper";
            clause_string += "(";
            clause_string += this->getMapperIdentifier();
            clause_string += ")";
            break;
        default:
            ;
    }
    switch (modifier2) {
        case OMPC_MAP_MODIFIER_always:
            clause_string += " always";
            break;
        case OMPC_MAP_MODIFIER_close:
            clause_string += " close";
            break;
        case OMPC_MAP_MODIFIER_mapper:
            clause_string += " mapper";
            clause_string += "(";
            clause_string += this->getMapperIdentifier();
            clause_string += ")";
            break;
        default:
            ;
    }
    switch (modifier3) {
        case OMPC_MAP_MODIFIER_always:
            clause_string += " always";
            break;
        case OMPC_MAP_MODIFIER_close:
            clause_string += " close";
            break;
        case OMPC_MAP_MODIFIER_mapper:
            clause_string += " mapper";
            clause_string += "(";
            clause_string += this->getMapperIdentifier();
            clause_string += ")";
            break;
        default:
            ;
    }

    switch (type) {
        case OMPC_MAP_TYPE_to:
            clause_string += " to";
            break;
        case OMPC_MAP_TYPE_from:
            clause_string += " from";
            break;
        case OMPC_MAP_TYPE_tofrom:
            clause_string += " tofrom";
            break;
        case OMPC_MAP_TYPE_alloc:
            clause_string += " alloc";
            break;
        case OMPC_MAP_TYPE_release:
            clause_string += " release";
            break;
        case OMPC_MAP_TYPE_delete:
            clause_string += " delete";
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += " : ";
    };
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}